

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase58::run(TestCase58 *this)

{
  Builder builder_00;
  Builder builder_01;
  Reader reader;
  Reader reader_00;
  Builder *value;
  Builder *value_00;
  undefined8 in_stack_fffffffffffffd80;
  MessageBuilder *this_00;
  BuilderFor<DynamicTypeFor<FromBuilder<Builder_&>_>_>_conflict local_268;
  BuilderFor<DynamicTypeFor<FromBuilder<Builder_&>_>_>_conflict local_238;
  Reader local_208;
  Reader local_1d0;
  ReaderFor<DynamicTypeFor<FromReader<Reader>_>_> local_1a0;
  SegmentBuilder *local_168;
  SegmentBuilder *pSStack_160;
  CapTableBuilder *local_158;
  void *pvStack_150;
  WirePointer *local_148;
  undefined1 auStack_128 [8];
  Builder root;
  MallocMessageBuilder builder;
  TestCase58 *this_local;
  
  this_00 = (MessageBuilder *)&root._builder.dataSize;
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)this_00,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAllTypes>
            ((Builder *)auStack_128,this_00);
  local_148 = root._builder.pointers;
  local_158 = root._builder.capTable;
  pvStack_150 = root._builder.data;
  local_168 = (SegmentBuilder *)auStack_128;
  pSStack_160 = root._builder.segment;
  builder_00._builder.capTable = root._builder.capTable;
  builder_00._builder.segment = root._builder.segment;
  builder_00._builder.data = root._builder.data;
  builder_00._builder.pointers = root._builder.pointers;
  builder_00._builder.dataSize = (int)in_stack_fffffffffffffd80;
  builder_00._builder.pointerCount = (short)((ulong)in_stack_fffffffffffffd80 >> 0x20);
  builder_00._builder._38_2_ = (short)((ulong)in_stack_fffffffffffffd80 >> 0x30);
  initTestMessage(builder_00);
  capnproto_test::capnp::test::TestAllTypes::Builder::asReader(&local_1d0,(Builder *)auStack_128);
  toDynamic<capnproto_test::capnp::test::TestAllTypes::Reader>(&local_1a0,&local_1d0);
  reader.reader.segment = (SegmentReader *)local_1a0.reader.capTable;
  reader.schema.super_Schema.raw = (Schema)(Schema)local_1a0.reader.segment;
  reader.reader.capTable = (CapTableReader *)local_1a0.reader.data;
  reader.reader.data = local_1a0.reader.pointers;
  reader.reader.pointers = (WirePointer *)local_1a0.reader._32_8_;
  reader.reader.dataSize = local_1a0.reader.nestingLimit;
  reader.reader.pointerCount = local_1a0.reader._44_2_;
  reader.reader._38_2_ = local_1a0.reader._46_2_;
  reader.reader._40_8_ = this_00;
  checkDynamicTestMessage(reader);
  toDynamic<capnproto_test::capnp::test::TestAllTypes::Builder&>
            (&local_238,(capnp *)auStack_128,value);
  DynamicStruct::Builder::asReader(&local_208,&local_238);
  reader_00.reader.segment = (SegmentReader *)local_208.reader.capTable;
  reader_00.schema.super_Schema.raw = (Schema)(Schema)local_208.reader.segment;
  reader_00.reader.capTable = (CapTableReader *)local_208.reader.data;
  reader_00.reader.data = local_208.reader.pointers;
  reader_00.reader.pointers = (WirePointer *)local_208.reader._32_8_;
  reader_00.reader.dataSize = local_208.reader.nestingLimit;
  reader_00.reader.pointerCount = local_208.reader._44_2_;
  reader_00.reader._38_2_ = local_208.reader._46_2_;
  reader_00.reader._40_8_ = this_00;
  checkDynamicTestMessage(reader_00);
  toDynamic<capnproto_test::capnp::test::TestAllTypes::Builder&>
            (&local_268,(capnp *)auStack_128,value_00);
  builder_01.builder.segment = (SegmentBuilder *)local_268.builder.capTable;
  builder_01.schema.super_Schema.raw = (Schema)(Schema)local_268.builder.segment;
  builder_01.builder.capTable = (CapTableBuilder *)local_268.builder.data;
  builder_01.builder.data = local_268.builder.pointers;
  builder_01.builder.pointers = (WirePointer *)local_268.builder._32_8_;
  builder_01.builder.dataSize = local_208.reader.nestingLimit;
  builder_01.builder.pointerCount = local_208.reader._44_2_;
  builder_01.builder._38_2_ = local_208.reader._46_2_;
  checkDynamicTestMessage(builder_01);
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&root._builder.dataSize);
  return;
}

Assistant:

TEST(DynamicApi, Read) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<TestAllTypes>();

  initTestMessage(root);

  checkDynamicTestMessage(toDynamic(root.asReader()));
  checkDynamicTestMessage(toDynamic(root).asReader());
  checkDynamicTestMessage(toDynamic(root));
}